

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

ATNPath * __thiscall
Centaurus::CompositeATN<char>::convert_atn_path
          (ATNPath *__return_storage_ptr__,CompositeATN<char> *this,ATNPath *path)

{
  int iVar1;
  Identifier *__k;
  mapped_type *this_00;
  CATNMachine<char> *machine;
  ATNPath *path_local;
  CompositeATN<char> *this_local;
  
  __k = ATNPath::leaf_id(path);
  this_00 = std::
            unordered_map<Centaurus::Identifier,_Centaurus::CATNMachine<char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<char>_>_>_>
            ::at(&this->m_dict,__k);
  iVar1 = ATNPath::leaf_index(path);
  iVar1 = CATNMachine<char>::convert_atn_index(this_00,iVar1);
  ATNPath::replace_index(__return_storage_ptr__,path,iVar1);
  return __return_storage_ptr__;
}

Assistant:

const ATNPath convert_atn_path(const ATNPath& path) const
    {
        const CATNMachine<TCHAR>& machine = m_dict.at(path.leaf_id());

        return path.replace_index(machine.convert_atn_index(path.leaf_index()));
    }